

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cpp
# Opt level: O0

void __thiscall dpfb::Font::readKerningPairs(Font *this)

{
  value_type *pvVar1;
  bool bVar2;
  value_type *pvVar3;
  value_type local_a8;
  char32_t local_9c;
  reference pvStack_98;
  char32_t cp2;
  value_type *rawKerningPair_1;
  char32_t cp1;
  uint16_t glyphIdx1;
  value_type *rawKerningPair;
  size_t i;
  vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> local_70;
  vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> local_48;
  undefined1 local_30 [8];
  vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> rawKerningPairs;
  KerningParams kerningParams;
  Font *this_local;
  
  rawKerningPairs.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (this->bakingOptions).fontPxSize;
  rawKerningPairs.super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)(this->head).unitsPerEm;
  std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::vector
            ((vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> *)local_30);
  if (((this->bakingOptions).kerningSource == gpos) ||
     ((this->bakingOptions).kerningSource == kernAndGpos)) {
    readKerningPairsGpos
              (&local_48,&(this->fontStream).super_Stream,&this->sfntOffsetTable,
               (KerningParams *)
               &rawKerningPairs.
                super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::operator=
              ((vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> *)local_30,
               &local_48);
    std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::~vector(&local_48);
  }
  if (((this->bakingOptions).kerningSource == kern) ||
     (((this->bakingOptions).kerningSource == kernAndGpos &&
      (bVar2 = std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::empty
                         ((vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> *)
                          local_30), bVar2)))) {
    readKerningPairsKern
              (&local_70,&(this->fontStream).super_Stream,&this->sfntOffsetTable,
               (KerningParams *)
               &rawKerningPairs.
                super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::operator=
              ((vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> *)local_30,
               &local_70);
    std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::~vector(&local_70);
  }
  bVar2 = std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::empty
                    ((vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> *)local_30
                    );
  if (bVar2) {
    i._4_4_ = 1;
  }
  else {
    sortGlyphs(this,glyphIdx);
    rawKerningPair = (value_type *)0x0;
    while (pvVar1 = rawKerningPair,
          pvVar3 = (value_type *)
                   std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::size
                             ((vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> *
                              )local_30), pvVar1 < pvVar3) {
      _cp1 = std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::operator[]
                       ((vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> *)
                        local_30,(size_type)rawKerningPair);
      if (_cp1->amount == 0) {
        __assert_fail("rawKerningPair.amount != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/font.cpp"
                      ,0x27a,"void dpfb::Font::readKerningPairs()");
      }
      rawKerningPair_1._6_2_ = _cp1->glyphIdx1;
      rawKerningPair_1._0_4_ = glyphIdxToCp(this,(uint)rawKerningPair_1._6_2_);
      while ((pvVar1 = rawKerningPair,
             pvVar3 = (value_type *)
                      std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::size
                                ((vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
                                  *)local_30), pvVar1 < pvVar3 &&
             (pvStack_98 = std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
                           ::operator[]((vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
                                         *)local_30,(size_type)rawKerningPair),
             pvStack_98->glyphIdx1 == rawKerningPair_1._6_2_))) {
        rawKerningPair = (value_type *)((long)&rawKerningPair->glyphIdx1 + 1);
        if (pvStack_98->amount == 0) {
          __assert_fail("rawKerningPair.amount != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/font.cpp"
                        ,0x28b,"void dpfb::Font::readKerningPairs()");
        }
        if (((char32_t)rawKerningPair_1 != L'\0') &&
           (local_9c = glyphIdxToCp(this,(uint)pvStack_98->glyphIdx2), local_9c != L'\0')) {
          local_a8.cp1 = (char32_t)rawKerningPair_1;
          local_a8.amount = pvStack_98->amount;
          local_a8.cp2 = local_9c;
          std::vector<dpfb::KerningPair,_std::allocator<dpfb::KerningPair>_>::push_back
                    (&this->kerningPairs,&local_a8);
        }
      }
    }
    i._4_4_ = 0;
  }
  std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::~vector
            ((vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> *)local_30);
  return;
}

Assistant:

void Font::readKerningPairs()
{
    const KerningParams kerningParams {
        bakingOptions.fontPxSize,
        head.unitsPerEm
    };

    std::vector<RawKerningPair> rawKerningPairs;
    if (bakingOptions.kerningSource == KerningSource::gpos
            || bakingOptions.kerningSource == KerningSource::kernAndGpos)
        rawKerningPairs = readKerningPairsGpos(
            fontStream, sfntOffsetTable, kerningParams);

    // According to the OpenType manual, the "kern" table should be
    // applied when there is no GPOS table, or if the GPOS table doesn't
    // contain any "kern" features for the resolved language.
    // https://docs.microsoft.com/en-us/typography/opentype/spec/recom
    if (bakingOptions.kerningSource == KerningSource::kern
            || (bakingOptions.kerningSource == KerningSource::kernAndGpos
                && rawKerningPairs.empty()))
        rawKerningPairs = readKerningPairsKern(
            fontStream, sfntOffsetTable, kerningParams);
    if (rawKerningPairs.empty())
        return;

    // Prepare for binary search
    sortGlyphs(GlyphsOrder::glyphIdx);

    std::size_t i = 0;
    while (i < rawKerningPairs.size()) {
        const auto& rawKerningPair = rawKerningPairs[i];

        assert(rawKerningPair.amount != 0);

        const auto glyphIdx1 = rawKerningPair.glyphIdx1;
        const auto cp1 = glyphIdxToCp(glyphIdx1);

        // The raw pairs are grouped by the first glyph index (but
        // not necessarily fully sorted in case of GPOS as we read
        // pairs for multiple languages), so we can avoid calling
        // glyphIdxToCp() every time for the first code point in a
        // sequence.
        while (i < rawKerningPairs.size()) {
            const auto& rawKerningPair = rawKerningPairs[i];
            if (rawKerningPair.glyphIdx1 != glyphIdx1)
                break;

            ++i;

            assert(rawKerningPair.amount != 0);

            if (cp1 == 0)
                continue;

            const auto cp2 = glyphIdxToCp(rawKerningPair.glyphIdx2);
            if (cp2 == 0)
                continue;

            kerningPairs.push_back({cp1, cp2, rawKerningPair.amount});
        }
    }
}